

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWindowsRegistry.cxx
# Opt level: O2

optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
cmWindowsRegistry::ExpandExpression_abi_cxx11_
          (optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,cmWindowsRegistry *this,string_view expression,View view,
          string_view separator)

{
  string_view *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  size_type __n;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_1ca;
  allocator<char> local_1c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  ulong local_1a0;
  size_type local_198;
  optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_190;
  string_view expression_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178;
  ExpressionParser local_160;
  
  expression_local._M_str = expression._M_str;
  expression_local._M_len = expression._M_len;
  local_1c8._0_16_ = expression;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_160,(basic_string_view<char,_std::char_traits<char>_> *)&local_1c8,
             (allocator<char> *)&local_178);
  local_160.Separator._M_len = 1;
  local_160.Separator._M_str = ";";
  cmsys::RegularExpression::RegularExpression
            (&local_160.RegistryFormat,
             "\\[({.+})?(HKCU|HKEY_CURRENT_USER|HKLM|HKEY_LOCAL_MACHINE|HKCR|HKEY_CLASSES_ROOT|HKCC|HKEY_CURRENT_CONFIG|HKU|HKEY_USERS)[/\\]?([^]]*)\\]"
            );
  local_160.RootKey._M_len = 0;
  local_160.RootKey._M_str = (pointer)0x0;
  local_160.SubKey = (string_view)ZEXT816(0);
  local_160.ValueName = (string_view)ZEXT816(0);
  bVar1 = cmsys::RegularExpression::find(&local_160.RegistryFormat,&local_160.Expression);
  if (bVar1) {
    local_1c8._M_dataplus._M_p =
         (pointer)((long)local_160.RegistryFormat.regmatch.endp[1] -
                  (long)local_160.RegistryFormat.regmatch.startp[1]);
    local_1c8._M_string_length =
         (size_type)
         (local_160.Expression._M_dataplus._M_p +
         ((long)local_160.RegistryFormat.regmatch.startp[1] -
         (long)local_160.RegistryFormat.regmatch.searchstring));
    if (local_1c8._M_dataplus._M_p == (pointer)0x0) {
      local_1c8._M_string_length = (size_type)local_160.Separator._M_str;
      local_1c8._M_dataplus._M_p = (pointer)local_160.Separator._M_len;
    }
    else {
      local_1c8._0_16_ =
           std::basic_string_view<char,_std::char_traits<char>_>::substr
                     ((basic_string_view<char,_std::char_traits<char>_> *)&local_1c8,1,
                      (long)local_1c8._M_dataplus._M_p - 2);
    }
    this_00 = &local_160.SubKey;
    local_160.RootKey._M_len =
         (long)local_160.RegistryFormat.regmatch.endp[2] -
         (long)local_160.RegistryFormat.regmatch.startp[2];
    local_160.RootKey._M_str =
         local_160.Expression._M_dataplus._M_p +
         ((long)local_160.RegistryFormat.regmatch.startp[2] -
         (long)local_160.RegistryFormat.regmatch.searchstring);
    local_160.SubKey._M_str =
         local_160.Expression._M_dataplus._M_p +
         ((long)local_160.RegistryFormat.regmatch.startp[3] -
         (long)local_160.RegistryFormat.regmatch.searchstring);
    local_160.SubKey._M_len =
         (long)local_160.RegistryFormat.regmatch.endp[3] -
         (long)local_160.RegistryFormat.regmatch.startp[3];
    __n = std::basic_string_view<char,_std::char_traits<char>_>::find
                    (this_00,local_1c8._M_string_length,0,local_1c8._M_dataplus._M_p);
    if (__n == 0xffffffffffffffff) {
      local_160.ValueName = (string_view)(ZEXT816(0x6bb539) << 0x40);
    }
    else {
      local_160.ValueName =
           std::basic_string_view<char,_std::char_traits<char>_>::substr
                     (this_00,(size_type)(local_1c8._M_dataplus._M_p + __n),0xffffffffffffffff);
      pcVar5 = local_160.ValueName._M_str;
      uVar4 = local_160.ValueName._M_len;
      if (uVar4 != 0) {
        uVar6 = 9;
        if (uVar4 < 9) {
          uVar6 = uVar4;
        }
        uVar7 = 0;
        local_1a0 = uVar4;
        local_198 = __n;
        local_190 = __return_storage_ptr__;
        do {
          iVar2 = tolower((int)pcVar5[uVar7]);
          iVar3 = tolower((int)"(default)"[uVar7]);
          iVar2 = iVar2 - iVar3;
          if (iVar2 != 0) goto LAB_003df1cd;
          uVar7 = uVar7 + 1;
        } while (uVar6 != uVar7);
        iVar2 = (int)local_1a0 + -9;
LAB_003df1cd:
        __return_storage_ptr__ = local_190;
        __n = local_198;
        if (iVar2 == 0) {
          local_160.ValueName = (string_view)(ZEXT816(0x6bb539) << 0x40);
        }
      }
      local_160.SubKey =
           std::basic_string_view<char,_std::char_traits<char>_>::substr(this_00,0,__n);
    }
    (__return_storage_ptr__->
    super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_engaged = false;
  }
  else {
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_1c8,&expression_local,&local_1c9);
    __l._M_len = 1;
    __l._M_array = &local_1c8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_178,__l,&local_1ca);
    *(pointer *)
     &(__return_storage_ptr__->
      super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_payload._M_value.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl = local_178.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
             )._M_payload.
             super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_payload._M_value.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl + 8) =
         local_178.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
             )._M_payload.
             super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_payload._M_value.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl + 0x10) =
         local_178.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_178.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_178.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_178.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->
    super__Optional_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_engaged = true;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_178);
    std::__cxx11::string::~string((string *)&local_1c8);
  }
  anon_unknown.dwarf_1568cef::ExpressionParser::~ExpressionParser(&local_160);
  return __return_storage_ptr__;
}

Assistant:

cm::optional<std::vector<std::string>> cmWindowsRegistry::ExpandExpression(
  cm::string_view expression, View view, cm::string_view separator)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
  static std::string NOTFOUND{ "/REGISTRY-NOTFOUND" };

  this->LastError.clear();

  // compute list of registry views
  auto views = this->ComputeViews(view);
  std::vector<std::string> result;

  for (auto v : views) {
    ExpressionParser parser(expression);

    while (parser.Find()) {
      try {
        auto handler =
          KeyHandler::OpenKey(parser.GetRootKey(), parser.GetSubKey(), v);
        auto data = handler.ReadValue(parser.GetValueName(),
                                      this->SupportedTypes, separator);
        parser.Replace(data);
      } catch (const registry_error& e) {
        this->LastError = e.what();
        parser.Replace(NOTFOUND);
        continue;
      }
    }
    result.emplace_back(parser.GetExpression());
    if (expression == parser.GetExpression()) {
      // there no substitutions, so can ignore other views
      break;
    }
  }

  return result;
#else
  (void)view;
  (void)separator;

  ExpressionParser parser(expression);
  if (parser.Find()) {
    // expression holds unsupported registry access
    // so the expression cannot be used on this platform
    return cm::nullopt;
  }
  return std::vector<std::string>{ std::string{ expression } };
#endif
}